

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall ipx::Model::LoadPrimal(Model *this)

{
  double dVar1;
  int iVar2;
  size_t sVar3;
  pointer pcVar4;
  double *pdVar5;
  int iVar6;
  double *pdVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  size_t sVar11;
  
  this->num_rows_ = this->num_constr_;
  this->num_cols_ = this->num_var_;
  this->dualized_ = false;
  (this->AI_).nrow_ = (this->A_).nrow_;
  std::vector<int,_std::allocator<int>_>::operator=(&(this->AI_).colptr_,&(this->A_).colptr_);
  std::vector<int,_std::allocator<int>_>::operator=(&(this->AI_).rowidx_,&(this->A_).rowidx_);
  std::vector<double,_std::allocator<double>_>::operator=(&(this->AI_).values_,&(this->A_).values_);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->AI_).rowidx_queue_,&(this->A_).rowidx_queue_);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->AI_).values_queue_,&(this->A_).values_queue_);
  if (0 < this->num_constr_) {
    iVar6 = 0;
    do {
      SparseMatrix::push_back(&this->AI_,iVar6,1.0);
      SparseMatrix::add_column(&this->AI_);
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->num_constr_);
  }
  sVar3 = (this->b_)._M_size;
  sVar11 = (this->scaled_rhs_)._M_size;
  if (sVar3 == sVar11) {
    if (sVar3 == 0) goto LAB_003a8493;
    pdVar5 = (this->b_)._M_data;
    pdVar7 = (this->scaled_rhs_)._M_data;
  }
  else {
    pdVar5 = (this->b_)._M_data;
    if (pdVar5 != (double *)0x0) {
      operator_delete(pdVar5);
      sVar11 = (this->scaled_rhs_)._M_size;
    }
    (this->b_)._M_size = sVar11;
    pdVar5 = (double *)operator_new(sVar11 << 3);
    (this->b_)._M_data = pdVar5;
    pdVar7 = (this->scaled_rhs_)._M_data;
    if (pdVar7 == (double *)0x0) goto LAB_003a8493;
    sVar3 = (this->b_)._M_size;
  }
  memcpy(pdVar5,pdVar7,sVar3 << 3);
LAB_003a8493:
  sVar11 = (long)this->num_constr_ + (long)this->num_var_;
  pdVar5 = (this->c_)._M_data;
  if ((this->c_)._M_size != sVar11) {
    operator_delete(pdVar5);
    (this->c_)._M_size = sVar11;
    pdVar5 = (double *)operator_new(sVar11 * 8);
    (this->c_)._M_data = pdVar5;
  }
  if ((int)sVar11 != 0) {
    memset(pdVar5,0,sVar11 * 8);
  }
  pdVar7 = (double *)(this->c_)._M_size;
  if (pdVar7 != (double *)0x0) {
    memset(pdVar5,0,(long)pdVar7 * 8);
  }
  if (0 < (long)this->num_var_) {
    if (pdVar7 != (double *)0x0) {
      pdVar7 = (this->c_)._M_data;
    }
    pdVar5 = (double *)(this->scaled_obj_)._M_size;
    if (pdVar5 != (double *)0x0) {
      pdVar5 = (this->scaled_obj_)._M_data;
    }
    memmove(pdVar7,pdVar5,(long)this->num_var_ << 3);
  }
  sVar11 = (long)this->num_cols_ + (long)this->num_rows_;
  pdVar5 = (this->lb_)._M_data;
  if ((this->lb_)._M_size != sVar11) {
    operator_delete(pdVar5);
    (this->lb_)._M_size = sVar11;
    pdVar5 = (double *)operator_new(sVar11 * 8);
    (this->lb_)._M_data = pdVar5;
  }
  if ((int)sVar11 != 0) {
    memset(pdVar5,0,sVar11 * 8);
  }
  if (0 < (long)this->num_var_) {
    pdVar5 = (double *)(this->lb_)._M_size;
    pdVar7 = (double *)(this->scaled_lbuser_)._M_size;
    if (pdVar5 != (double *)0x0) {
      pdVar5 = (this->lb_)._M_data;
    }
    if (pdVar7 != (double *)0x0) {
      pdVar7 = (this->scaled_lbuser_)._M_data;
    }
    memmove(pdVar5,pdVar7,(long)this->num_var_ << 3);
  }
  sVar11 = (long)this->num_cols_ + (long)this->num_rows_;
  pdVar5 = (this->ub_)._M_data;
  if ((this->ub_)._M_size != sVar11) {
    operator_delete(pdVar5);
    (this->ub_)._M_size = sVar11;
    pdVar5 = (double *)operator_new(sVar11 * 8);
    (this->ub_)._M_data = pdVar5;
  }
  if ((int)sVar11 != 0) {
    memset(pdVar5,0,sVar11 * 8);
  }
  if (0 < (long)this->num_var_) {
    pdVar5 = (double *)(this->ub_)._M_size;
    pdVar7 = (double *)(this->scaled_ubuser_)._M_size;
    if (pdVar5 != (double *)0x0) {
      pdVar5 = (this->ub_)._M_data;
    }
    if (pdVar7 != (double *)0x0) {
      pdVar7 = (this->scaled_ubuser_)._M_data;
    }
    memmove(pdVar5,pdVar7,(long)this->num_var_ << 3);
  }
  iVar6 = this->num_constr_;
  if (0 < (long)iVar6) {
    iVar2 = this->num_var_;
    pdVar5 = (this->ub_)._M_data;
    pdVar7 = (this->lb_)._M_data;
    pcVar4 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      bVar9 = pcVar4[lVar8] - 0x3c;
      if (bVar9 < 3) {
        lVar10 = (ulong)bVar9 * 8;
        dVar1 = *(double *)(&DAT_003dc978 + lVar10);
        pdVar7[iVar2 + lVar8] = *(double *)(&DAT_003dc960 + lVar10);
        pdVar5[iVar2 + lVar8] = dVar1;
      }
      lVar8 = lVar8 + 1;
    } while (iVar6 != lVar8);
  }
  return;
}

Assistant:

void Model::LoadPrimal() {
    num_rows_ = num_constr_;
    num_cols_ = num_var_;
    dualized_ = false;

    // Copy A and append identity matrix.
    AI_ = A_;
    for (Int i = 0; i < num_constr_; i++) {
        AI_.push_back(i, 1.0);
        AI_.add_column();
    }
    assert(AI_.cols() == num_var_+num_constr_);

    // Copy vectors and set bounds on slack variables.
    b_ = scaled_rhs_;
    c_.resize(num_var_+num_constr_);
    c_ = 0.0;
    std::copy_n(std::begin(scaled_obj_), num_var_, std::begin(c_));
    lb_.resize(num_rows_+num_cols_);
    std::copy_n(std::begin(scaled_lbuser_), num_var_, std::begin(lb_));
    ub_.resize(num_rows_+num_cols_);
    std::copy_n(std::begin(scaled_ubuser_), num_var_, std::begin(ub_));
    for (Int i = 0; i < num_constr_; i++) {
        switch(constr_type_[i]) {
        case '=':
            lb_[num_var_+i] = 0.0;
            ub_[num_var_+i] = 0.0;
            break;
        case '<':
            lb_[num_var_+i] = 0.0;
            ub_[num_var_+i] = INFINITY;
            break;
        case '>':
            lb_[num_var_+i] = -INFINITY;
            ub_[num_var_+i] = 0.0;
            break;
        }
    }
}